

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int64_t GmfStatKwd(int64_t MshIdx,int KwdCod,...)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  undefined4 *in_RDX;
  long lVar4;
  undefined4 *in_stack_00000008;
  undefined4 *local_a0;
  long local_98;
  undefined4 *local_90;
  va_list VarArg;
  
  if (0xffffff0f < KwdCod - 0xf1U) {
    lVar3 = (ulong)(uint)KwdCod * 0x3300;
    lVar4 = *(long *)(MshIdx + 0x10d8 + lVar3);
    if (lVar4 != 0) {
      lVar3 = lVar3 + MshIdx;
      if (*(int *)(lVar3 + 0x110) != 3) {
        return lVar4;
      }
      *in_RDX = *(undefined4 *)(lVar3 + 0x124);
      *local_a0 = *(undefined4 *)(lVar3 + 0x11c);
      for (lVar4 = 0; lVar4 < *(int *)(lVar3 + 0x124); lVar4 = lVar4 + 1) {
        *(undefined4 *)(local_98 + lVar4 * 4) = *(undefined4 *)(lVar3 + 0x128 + lVar4 * 4);
      }
      pbVar1 = (byte *)GmfKwdFmt[(uint)KwdCod][2];
      uVar2 = *pbVar1 - 0x68;
      if ((uVar2 == 0) && (uVar2 = pbVar1[1] - 0x72, uVar2 == 0)) {
        uVar2 = (uint)pbVar1[2];
      }
      if (uVar2 == 0) {
        *local_90 = *(undefined4 *)(lVar3 + 0x114);
        *in_stack_00000008 = *(undefined4 *)(lVar3 + 0x118);
      }
      return *(int64_t *)(lVar3 + 0x10d8);
    }
  }
  return 0;
}

Assistant:

int64_t GmfStatKwd(int64_t MshIdx, int KwdCod, ...)
{
   int         i, *PtrNmbTyp, *PtrSolSiz, *TypTab, *PtrDeg, *PtrNmbNod;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;
   va_list     VarArg;

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);

   kwd = &msh->KwdTab[ KwdCod ];

   if(!kwd->NmbLin)
      return(0);

   // Read further arguments if this kw is a sol
   if(kwd->typ == SolKwd)
   {
      va_start(VarArg, KwdCod);

      PtrNmbTyp = va_arg(VarArg, int *);
      *PtrNmbTyp = kwd->NmbTyp;

      PtrSolSiz = va_arg(VarArg, int *);
      *PtrSolSiz = kwd->SolSiz;

      TypTab = va_arg(VarArg, int *);

      for(i=0;i<kwd->NmbTyp;i++)
         TypTab[i] = kwd->TypTab[i];

      // Add two extra paramaters for HO elements: degree and nmb nodes
      if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]) )
      {
         PtrDeg = va_arg(VarArg, int *);
         *PtrDeg = kwd->deg;
         
         PtrNmbNod = va_arg(VarArg, int *);
         *PtrNmbNod = kwd->NmbNod;
      }

      va_end(VarArg);
   }

   return(kwd->NmbLin);
}